

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_bcth(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int reg;
  int imm;
  DisasJumpType DVar1;
  TCGv_i64 ret;
  TCGv_i32 ret_00;
  uintptr_t o_1;
  DisasCompare_conflict2 local_48;
  
  tcg_ctx = s->uc->tcg_ctx;
  reg = get_field1(s,FLD_O_r1,FLD_C_b1);
  imm = get_field1(s,FLD_O_i2,FLD_C_b2);
  local_48._0_1_ = 9;
  local_48.is_64 = false;
  local_48.g1 = false;
  local_48.g2 = false;
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_shri_i64_s390x(tcg_ctx,ret,tcg_ctx->regs[reg],0x20);
  tcg_gen_subi_i64_s390x(tcg_ctx,ret,ret,1);
  store_reg32h_i64(tcg_ctx,reg,ret);
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  local_48.u.s32.a = ret_00;
  local_48.u.s32.b = tcg_const_i32_s390x(tcg_ctx,0);
  tcg_gen_extrl_i64_i32_s390x(tcg_ctx,ret_00,ret);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  DVar1 = help_branch(s,&local_48,true,imm,o->in2);
  return DVar1;
}

Assistant:

static DisasJumpType op_bcth(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    int imm = get_field(s, i2);
    DisasCompare c;
    TCGv_i64 t;

    c.cond = TCG_COND_NE;
    c.is_64 = false;
    c.g1 = false;
    c.g2 = false;

    t = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_shri_i64(tcg_ctx, t, tcg_ctx->regs[r1], 32);
    tcg_gen_subi_i64(tcg_ctx, t, t, 1);
    store_reg32h_i64(tcg_ctx, r1, t);
    c.u.s32.a = tcg_temp_new_i32(tcg_ctx);
    c.u.s32.b = tcg_const_i32(tcg_ctx, 0);
    tcg_gen_extrl_i64_i32(tcg_ctx, c.u.s32.a, t);
    tcg_temp_free_i64(tcg_ctx, t);

    return help_branch(s, &c, 1, imm, o->in2);
}